

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::ForkBranch<kj::_::Void,_true>::get
          (ForkBranch<kj::_::Void,_true> *this,ExceptionOrValue *output)

{
  ExceptionOrValue *pEVar1;
  bool bVar2;
  
  pEVar1 = ((this->super_ForkBranchBase).hub.ptr)->resultRef;
  bVar2 = true;
  if (pEVar1[1].exception.ptr.isSet == false) {
    if (output[1].exception.ptr.isSet != true) goto LAB_001ad07c;
    bVar2 = false;
  }
  output[1].exception.ptr.isSet = bVar2;
LAB_001ad07c:
  if (pEVar1 != output) {
    if ((output->exception).ptr.isSet == true) {
      (output->exception).ptr.isSet = false;
      Exception::~Exception(&(output->exception).ptr.field_1.value);
    }
    if ((pEVar1->exception).ptr.isSet == true) {
      Exception::Exception
                (&(output->exception).ptr.field_1.value,&(pEVar1->exception).ptr.field_1.value);
      (output->exception).ptr.isSet = true;
    }
  }
  ForkBranchBase::releaseHub(&this->super_ForkBranchBase,output);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    ExceptionOr<T>& hubResult = getHubResultRef().template as<T>();
    KJ_IF_SOME(value, hubResult.value) {
      output.as<T>().value = copyOrAddRef(value);
    } else {
      output.as<T>().value = kj::none;
    }